

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

ArrayPtr<const_char> kj::anon_unknown_0::split(StringPtr *text,CharGroup_ *chars)

{
  bool bVar1;
  uchar c;
  unsigned_long *puVar2;
  StringPtr SVar3;
  ArrayPtr<const_char> AVar4;
  StringPtr local_78;
  char *local_68;
  size_t local_60;
  size_t local_58;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  CharGroup_ *chars_local;
  StringPtr *text_local;
  ArrayPtr<const_char> result;
  
  ___begin2 = indices<kj::StringPtr&>(text);
  __end2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator!=(&__end2,(Iterator *)&i);
    if (!bVar1) {
      AVar4 = StringPtr::asArray(text);
      StringPtr::StringPtr(&local_78,"");
      (text->content).ptr = local_78.content.ptr;
      (text->content).size_ = local_78.content.size_;
      return AVar4;
    }
    puVar2 = Range<unsigned_long>::Iterator::operator*(&__end2);
    local_58 = *puVar2;
    c = StringPtr::operator[](text,local_58);
    bVar1 = parse::CharGroup_::contains(chars,c);
    if (bVar1) break;
    Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  AVar4 = StringPtr::slice(text,0,local_58);
  SVar3 = StringPtr::slice(text,local_58);
  local_68 = SVar3.content.ptr;
  (text->content).ptr = local_68;
  local_60 = SVar3.content.size_;
  (text->content).size_ = local_60;
  return AVar4;
}

Assistant:

ArrayPtr<const char> split(StringPtr& text, const parse::CharGroup_& chars) {
  for (auto i: kj::indices(text)) {
    if (chars.contains(text[i])) {
      ArrayPtr<const char> result = text.slice(0, i);
      text = text.slice(i);
      return result;
    }
  }
  auto result = text.asArray();
  text = "";
  return result;
}